

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Set_Renderer(FT_Library library,FT_Renderer_conflict renderer,FT_UInt num_params,
                        FT_Parameter *parameters)

{
  FT_Renderer_SetModeFunc p_Var1;
  FT_ListNode node_00;
  FT_Renderer_SetModeFunc set_mode;
  FT_Error error;
  FT_ListNode node;
  FT_Parameter *parameters_local;
  FT_UInt num_params_local;
  FT_Renderer_conflict renderer_local;
  FT_Library library_local;
  
  set_mode._4_4_ = 0;
  if (library == (FT_Library)0x0) {
    set_mode._4_4_ = 0x21;
  }
  else if (renderer == (FT_Renderer_conflict)0x0) {
    set_mode._4_4_ = 6;
  }
  else if ((num_params == 0) || (parameters != (FT_Parameter *)0x0)) {
    node_00 = FT_List_Find(&library->renderers,renderer);
    if (node_00 == (FT_ListNode)0x0) {
      set_mode._4_4_ = 6;
    }
    else {
      FT_List_Up(&library->renderers,node_00);
      if (renderer->glyph_format == FT_GLYPH_FORMAT_OUTLINE) {
        library->cur_renderer = renderer;
      }
      p_Var1 = renderer->clazz->set_mode;
      node = (FT_ListNode)parameters;
      parameters_local._4_4_ = num_params;
      while ((parameters_local._4_4_ != 0 &&
             (set_mode._4_4_ = (*p_Var1)(renderer,(FT_ULong)node->prev,node->next),
             set_mode._4_4_ == 0))) {
        node = (FT_ListNode)&node->data;
        parameters_local._4_4_ = parameters_local._4_4_ - 1;
      }
    }
  }
  else {
    set_mode._4_4_ = 6;
  }
  return set_mode._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Set_Renderer( FT_Library     library,
                   FT_Renderer    renderer,
                   FT_UInt        num_params,
                   FT_Parameter*  parameters )
  {
    FT_ListNode  node;
    FT_Error     error = FT_Err_Ok;

    FT_Renderer_SetModeFunc  set_mode;


    if ( !library )
    {
      error = FT_THROW( Invalid_Library_Handle );
      goto Exit;
    }

    if ( !renderer )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( num_params > 0 && !parameters )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    node = FT_List_Find( &library->renderers, renderer );
    if ( !node )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    FT_List_Up( &library->renderers, node );

    if ( renderer->glyph_format == FT_GLYPH_FORMAT_OUTLINE )
      library->cur_renderer = renderer;

    set_mode = renderer->clazz->set_mode;

    for ( ; num_params > 0; num_params-- )
    {
      error = set_mode( renderer, parameters->tag, parameters->data );
      if ( error )
        break;
      parameters++;
    }

  Exit:
    return error;
  }